

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O1

int32_t getIndex2Block(UNewTrie2 *trie,UChar32 c,UBool forLSCP)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0x800;
  if ((c & 0xfffffc00U) != 0xd800 || forLSCP == '\0') {
    iVar2 = trie->index1[c >> 0xb];
    if (trie->index1[c >> 0xb] == trie->index2NullOffset) {
      iVar2 = trie->index2Length;
      iVar1 = -1;
      if ((long)iVar2 < 0x8a61) {
        trie->index2Length = iVar2 + 0x40;
        memcpy(trie->index2 + iVar2,trie->index2 + trie->index2NullOffset,0x100);
        iVar1 = iVar2;
      }
      iVar2 = -1;
      if (-1 < iVar1) {
        trie->index1[c >> 0xb] = iVar1;
        iVar2 = iVar1;
      }
    }
  }
  return iVar2;
}

Assistant:

static int32_t
getIndex2Block(UNewTrie2 *trie, UChar32 c, UBool forLSCP) {
    int32_t i1, i2;

    if(U_IS_LEAD(c) && forLSCP) {
        return UTRIE2_LSCP_INDEX_2_OFFSET;
    }

    i1=c>>UTRIE2_SHIFT_1;
    i2=trie->index1[i1];
    if(i2==trie->index2NullOffset) {
        i2=allocIndex2Block(trie);
        if(i2<0) {
            return -1;  /* program error */
        }
        trie->index1[i1]=i2;
    }
    return i2;
}